

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

void __thiscall
TPZFMatrix<Fad<float>_>::TimesBetaPlusZ
          (TPZFMatrix<Fad<float>_> *this,Fad<float> *beta,TPZFMatrix<Fad<float>_> *z)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  float *pfVar4;
  float *pfVar5;
  ulong uVar6;
  ulong uVar7;
  Fad<float> *pFVar8;
  long lVar9;
  Fad<float> *pFVar10;
  Fad<float> *pFVar11;
  float fVar12;
  
  lVar9 = (this->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol *
          (this->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow;
  if (0 < lVar9) {
    pFVar11 = this->fElem;
    pFVar10 = pFVar11 + lVar9;
    pFVar8 = z->fElem;
    do {
      uVar2 = (beta->dx_).num_elts;
      uVar6 = (ulong)uVar2;
      uVar3 = (pFVar11->dx_).num_elts;
      uVar7 = (ulong)uVar3;
      fVar12 = beta->val_;
      if (uVar6 == 0) {
        if ((uVar7 != 0) && (0 < (int)uVar3)) {
          pfVar4 = (pFVar11->dx_).ptr_to_data;
          uVar6 = 0;
          do {
            pfVar4[uVar6] = pfVar4[uVar6] * fVar12;
            uVar6 = uVar6 + 1;
          } while (uVar7 != uVar6);
        }
      }
      else {
        pfVar4 = (beta->dx_).ptr_to_data;
        if (uVar7 == 0) {
          (pFVar11->dx_).num_elts = uVar2;
          uVar7 = uVar6 * 4;
          if ((int)uVar2 < 0) {
            uVar7 = 0xffffffffffffffff;
          }
          pfVar5 = (float *)operator_new__(uVar7);
          (pFVar11->dx_).ptr_to_data = pfVar5;
          if (0 < (int)uVar2) {
            fVar1 = pFVar11->val_;
            uVar7 = 0;
            do {
              pfVar5[uVar7] = pfVar4[uVar7] * fVar1;
              uVar7 = uVar7 + 1;
            } while (uVar6 != uVar7);
          }
        }
        else if (0 < (int)uVar3) {
          pfVar5 = (pFVar11->dx_).ptr_to_data;
          uVar6 = 0;
          do {
            pfVar5[uVar6] = pFVar11->val_ * pfVar4[uVar6] + pfVar5[uVar6] * fVar12;
            uVar6 = uVar6 + 1;
          } while (uVar7 != uVar6);
        }
      }
      fVar12 = fVar12 * pFVar11->val_;
      pFVar11->val_ = fVar12;
      uVar2 = (pFVar8->dx_).num_elts;
      uVar7 = (ulong)uVar2;
      if (uVar7 != 0) {
        uVar3 = (pFVar11->dx_).num_elts;
        pfVar4 = (pFVar8->dx_).ptr_to_data;
        if ((ulong)uVar3 == 0) {
          (pFVar11->dx_).num_elts = uVar2;
          uVar6 = uVar7 * 4;
          if ((int)uVar2 < 0) {
            uVar6 = 0xffffffffffffffff;
          }
          pfVar5 = (float *)operator_new__(uVar6);
          (pFVar11->dx_).ptr_to_data = pfVar5;
          if (0 < (int)uVar2) {
            uVar6 = 0;
            do {
              pfVar5[uVar6] = pfVar4[uVar6];
              uVar6 = uVar6 + 1;
            } while (uVar7 != uVar6);
          }
        }
        else if (0 < (int)uVar3) {
          pfVar5 = (pFVar11->dx_).ptr_to_data;
          uVar7 = 0;
          do {
            pfVar5[uVar7] = pfVar4[uVar7] + pfVar5[uVar7];
            uVar7 = uVar7 + 1;
          } while (uVar3 != uVar7);
          fVar12 = pFVar11->val_;
        }
      }
      pfVar4 = &pFVar8->val_;
      pFVar8 = pFVar8 + 1;
      pFVar11->val_ = fVar12 + *pfVar4;
      pFVar11 = pFVar11 + 1;
    } while (pFVar11 < pFVar10);
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::TimesBetaPlusZ(const TVar beta,const TPZFMatrix<TVar> &z) {
    // #ifdef USING_ATLAS
    // 	int size = fRow*fCol;
    // 	cblas_dscal(size,beta,fElem,1);
    // 	cblas_daxpy(size,1.,z.fElem,1,fElem,1);
    // #else
    
    TVar * pt = fElem,  *ptlast = fElem + this->fRow*this->fCol;
    TVar * pz = z.fElem;
    //	while(pt < ptlast) *pt++ *= (beta) + *pz++;
    while(pt < ptlast) {
        *pt *= (beta);
        *pt++ += *pz++;
    }
    // #endif
}